

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::PrintTo<bool_const,proto2_unittest::Proto2MapEnum>
               (pair<const_bool,_proto2_unittest::Proto2MapEnum> *value,ostream *os)

{
  char *pcVar1;
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_12,1);
  pcVar1 = "optional_bool: false";
  if ((ulong)value->first != 0) {
    pcVar1 = "Saw json_name: true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1 + 0xf,(ulong)value->first ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  std::ostream::operator<<(os,value->second);
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_11,1);
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}